

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picker.cpp
# Opt level: O3

void __thiscall QtMWidgets::Picker::paintEvent(Picker *this,QPaintEvent *param_1)

{
  QAbstractItemModel *pQVar1;
  char cVar2;
  ColorGroup CVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  long *plVar8;
  int offset;
  PickerPrivate *pPVar9;
  QPainter p;
  QStyleOption opt;
  QPainter local_b0 [8];
  int local_a8;
  int local_a4;
  QModelIndex local_a0;
  QModelIndex local_88;
  QStyleOption local_70 [16];
  QRect local_60 [3];
  
  QStyleOption::QStyleOption(local_70,1,0);
  QStyleOption::initFrom((QWidget *)local_70);
  QPainter::QPainter(local_b0,(QPaintDevice *)&this->field_0x10);
  CVar3 = QWidget::palette();
  plVar8 = (long *)QPalette::brush(CVar3,Dark);
  drawCylinder(local_b0,local_60,(QColor *)(*plVar8 + 8),true,true);
  pPVar9 = (this->d).d;
  pQVar1 = pPVar9->model;
  QPersistentModelIndex::operator_cast_to_QModelIndex(&local_a0,&pPVar9->root);
  iVar4 = (**(code **)(*(long *)pQVar1 + 0x78))(pQVar1,&local_a0);
  if (0 < iVar4) {
    cVar2 = QPersistentModelIndex::isValid();
    pPVar9 = (this->d).d;
    if (cVar2 == '\0') {
      pQVar1 = pPVar9->model;
      iVar4 = pPVar9->modelColumn;
      QPersistentModelIndex::operator_cast_to_QModelIndex(&local_88,&pPVar9->root);
      (**(code **)(*(long *)pQVar1 + 0x60))(&local_a0,pQVar1,0,iVar4,&local_88);
      QPersistentModelIndex::operator=(&((this->d).d)->topItemIndex,&local_a0);
      pPVar9 = (this->d).d;
      pPVar9->drawItemOffset = 0;
    }
    PickerPrivate::initDrawOffsetForFirstUse(pPVar9);
    PickerPrivate::normalizeOffset((this->d).d);
    pPVar9 = (this->d).d;
    iVar7 = pPVar9->itemsCount;
    pQVar1 = pPVar9->model;
    QPersistentModelIndex::operator_cast_to_QModelIndex(&local_a0,&pPVar9->root);
    iVar5 = (**(code **)(*(long *)pQVar1 + 0x78))(pQVar1,&local_a0);
    pPVar9 = (this->d).d;
    iVar4 = pPVar9->itemsCount;
    offset = pPVar9->drawItemOffset;
    iVar6 = QPersistentModelIndex::row();
    local_a8 = iVar7 + (uint)(iVar4 <= iVar5);
    if (0 < local_a8) {
      pPVar9 = (this->d).d;
      iVar4 = 0;
      do {
        pQVar1 = pPVar9->model;
        QPersistentModelIndex::operator_cast_to_QModelIndex(&local_a0,&pPVar9->root);
        iVar7 = (**(code **)(*(long *)pQVar1 + 0x78))(pQVar1,&local_a0);
        if (iVar7 <= iVar4) break;
        pPVar9 = (this->d).d;
        pQVar1 = pPVar9->model;
        QPersistentModelIndex::operator_cast_to_QModelIndex(&local_a0,&pPVar9->root);
        iVar5 = (**(code **)(*(long *)pQVar1 + 0x78))(pQVar1,&local_a0);
        iVar7 = 0;
        if (iVar6 != iVar5) {
          iVar7 = iVar6;
        }
        pPVar9 = (this->d).d;
        pQVar1 = pPVar9->model;
        iVar6 = pPVar9->modelColumn;
        local_a4 = iVar4;
        QPersistentModelIndex::operator_cast_to_QModelIndex(&local_88,&pPVar9->root);
        (**(code **)(*(long *)pQVar1 + 0x60))(&local_a0,pQVar1,iVar7,iVar6,&local_88);
        PickerPrivate::drawItem(pPVar9,local_b0,local_70,offset,&local_a0);
        pPVar9 = (this->d).d;
        offset = offset + pPVar9->itemTopMargin + pPVar9->stringHeight;
        iVar6 = iVar7 + 1;
        iVar4 = local_a4 + 1;
      } while (local_a8 != iVar4);
    }
  }
  QPainter::~QPainter(local_b0);
  QStyleOption::~QStyleOption(local_70);
  return;
}

Assistant:

void
Picker::paintEvent( QPaintEvent * )
{
	QStyleOption opt;
	opt.initFrom( this );

	QPainter p( this );

	drawCylinder( &p, opt.rect, palette().color( QPalette::Dark ) );

	if( count() > 0 )
	{
		if( !d->topItemIndex.isValid() )
		{
			d->topItemIndex = d->model->index( 0, d->modelColumn, d->root );
			d->drawItemOffset = 0;
		}

		d->initDrawOffsetForFirstUse();
		d->normalizeOffset();

		int maxCount = d->itemsCount;

		if( count() >= d->itemsCount )
			++maxCount;

		int offset = d->drawItemOffset;

		for( int i = d->topItemIndex.row(), itemsCount = 0, scanedItems = 0;
			( itemsCount < maxCount ) && ( scanedItems < count() ) ;
			++i, ++scanedItems, ++itemsCount )
		{
			if( i == count() )
				i = 0;

			d->drawItem( &p, opt, offset,
				d->model->index( i, d->modelColumn, d->root ) );

			offset += d->itemTopMargin + d->stringHeight;
		}
	}
}